

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_nil
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  bool bVar1;
  element_type *peVar2;
  Atom *this_00;
  Atom local_38 [7];
  byte local_31;
  uint16_t *puStack_30;
  bool write_local;
  uint16_t *extent_index_local;
  Ptr *pPStack_20;
  uint16_t write_index_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_31 = write;
  puStack_30 = extent_index;
  extent_index_local._6_2_ = write_index;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar1 = std::operator==(&peVar2->cmd,"nil");
  if (bVar1) {
    if ((local_31 & 1) != 0) {
      r_code::Atom::Nil();
      this_00 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),
                           (ulong)extent_index_local._6_2_);
      r_code::Atom::operator=(this_00,local_38);
      r_code::Atom::~Atom(local_38);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_nil(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == "nil") {
        if (write) {
            current_object->code[write_index] = Atom::Nil();
        }

        return true;
    }

    return false;
}